

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# baseline.cc
# Opt level: O0

void init_global(baseline *data)

{
  feature_index i;
  long *in_RDI;
  features *unaff_retaddr;
  uchar *in_stack_ffffffffffffffe8;
  v_array<unsigned_char> *in_stack_fffffffffffffff0;
  
  if ((*(byte *)(in_RDI + 3) & 1) != 0) {
    v_array<unsigned_char>::push_back(in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8);
    i = *in_RDI + 0x3420;
    parameters::stride_shift((parameters *)((ulong)*(uint *)(in_RDI[1] + 0x288) * 0xb1c54b));
    features::push_back(unaff_retaddr,(feature_value)((ulong)in_RDI >> 0x20),i);
    *(float *)(*in_RDI + 0x68b4) = *(float *)(*in_RDI + 0x68b4) + 1.0;
    *(long *)(*in_RDI + 0x68a0) = *(long *)(*in_RDI + 0x68a0) + 1;
  }
  return;
}

Assistant:

void init_global(baseline& data)
{
  if (!data.global_only)
    return;
  // use a separate global constant
  data.ec->indices.push_back(constant_namespace);
  // different index from constant to avoid conflicts
  data.ec->feature_space[constant_namespace].push_back(
      1, ((constant - 17) * data.all->wpp) << data.all->weights.stride_shift());
  data.ec->total_sum_feat_sq++;
  data.ec->num_features++;
}